

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

uint32 __thiscall Clasp::Solver::analyzeConflict(Solver *this)

{
  LitVec *this_00;
  pointer pDVar1;
  uint uVar2;
  uint uVar3;
  Literal p_00;
  pointer puVar4;
  pointer pLVar5;
  bool bVar6;
  ClauseHead *rhs_00;
  long *plVar7;
  uint32 uVar8;
  uint32 uVar9;
  size_type i;
  uint uVar10;
  LitVec *out;
  Literal p;
  int local_78;
  uint32 lhsSize;
  Antecedent rhs;
  Antecedent lhs;
  Antecedent *local_60;
  Antecedent last;
  pair<Clasp::Literal,_int> local_48;
  LitVec *local_40;
  SolverStrategies local_38;
  
  plVar7 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
  (**(code **)(*plVar7 + 0x40))
            (plVar7,this,
             *(uint *)((this->levels_).super_type.ebo_.buf +
                      ((this->levels_).super_type.ebo_.size - 1)) & 0x3fffffff);
  p.rep_ = 0;
  this_00 = &this->cc_;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::assign(this_00,1,&p);
  local_60 = &lhs;
  lhs.data_ = 0;
  rhs.data_ = 0;
  last.data_ = 0;
  local_38 = this->strategy_;
  (this->bumpAct_).ebo_.size = 0;
  out = &this->conflict_;
  local_78 = 0;
  lhsSize = 0;
  local_40 = out;
  while( true ) {
    plVar7 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
    (**(code **)(*plVar7 + 0x50))(plVar7,this,out,p.rep_);
    uVar8 = 0;
    uVar9 = lhsSize;
    for (uVar10 = 0; out = local_40, uVar10 != (this->conflict_).ebo_.size; uVar10 = uVar10 + 1) {
      puVar4 = (this->assign_).assign_.ebo_.buf;
      pLVar5 = (this->conflict_).ebo_.buf;
      uVar2 = pLVar5[uVar10].rep_;
      uVar3 = *(uint *)((long)puVar4 + (ulong)(uVar2 & 0xfffffffc));
      uVar8 = (uVar8 + 1) - (uint)(uVar3 < 0x10);
      if ((uVar3 & 0xc) == 0) {
        uVar9 = uVar9 + 1;
        puVar4[uVar2 >> 2] = uVar3 | 0xc;
        if (uVar3 >> 4 == (this->levels_).super_type.ebo_.size) {
          local_78 = local_78 + 1;
        }
        else {
          local_48.first.rep_ = pLVar5[uVar10].rep_ & 0xfffffffe ^ 2;
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (this_00,&local_48.first);
          pDVar1 = (this->levels_).super_type.ebo_.buf + ((uVar3 >> 4) - 1);
          *(uint *)pDVar1 = *(uint *)pDVar1 | 0x40000000;
        }
      }
    }
    if (uVar9 != lhsSize) {
      lhs.data_ = 0;
    }
    if (uVar8 != uVar9) {
      rhs.data_ = 0;
    }
    if ((((ulong)local_38 & 0x6000000000) != 0) && (lhs.data_ != 0 || rhs.data_ != 0)) {
      otfs(this,&lhs,&rhs,p,local_78 == 1);
    }
    while( true ) {
      p_00.rep_ = (this->assign_).trail.ebo_.buf[(this->assign_).trail.ebo_.size - 1].rep_;
      puVar4 = (this->assign_).assign_.ebo_.buf;
      if ((*(byte *)((long)puVar4 + (ulong)(p_00.rep_ & 0xfffffffc)) & 0xc) != 0) break;
      Assignment::undoLast(&this->assign_);
    }
    rhs.data_ = (this->assign_).reason_.super_type.ebo_.buf[p_00.rep_ >> 2].data_;
    puVar4 = puVar4 + (p_00.rep_ >> 2);
    *(byte *)puVar4 = (byte)*puVar4 & 0xf3;
    local_78 = local_78 + -1;
    p.rep_ = p_00.rep_;
    if (local_78 == 0) break;
    lhsSize = uVar9 - 1;
    last.data_ = rhs.data_;
    reason(this,p_00,out);
  }
  ((this->cc_).ebo_.buf)->rep_ = p_00.rep_ & 0xfffffffe ^ 2;
  if (((this->strategy_).field_0x4 & 0x40) == 0) {
    if (lhs.data_ == 0) {
LAB_001637ce:
      rhs_00 = (ClauseHead *)0x0;
      goto LAB_001637ea;
    }
  }
  else if (lhs.data_ == 0) {
    if ((this->conflict_).ebo_.size + 1 < (this->cc_).ebo_.size) goto LAB_001637ce;
    local_60 = &last;
  }
  rhs_00 = clause(local_60);
LAB_001637ea:
  if ((((this->strategy_).field_0x6 & 4) != 0) &&
     (bVar6 = Antecedent::learnt((this->assign_).reason_.super_type.ebo_.buf + (p.rep_ >> 2)), bVar6
     )) {
    uVar10 = (**(code **)(*(long *)(this->assign_).reason_.super_type.ebo_.buf[p.rep_ >> 2].data_ +
                         0x60))();
    local_48.second = 0x7f;
    if ((uVar10 & 0x7f00000) != 0) {
      local_48.second = uVar10 >> 0x14 & 0x7f;
    }
    local_48.first.rep_ = p.rep_;
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    push_back(&this->bumpAct_,&local_48);
  }
  uVar9 = simplifyConflictClause(this,this_00,&this->ccInfo_,rhs_00);
  return uVar9;
}

Assistant:

uint32 Solver::analyzeConflict() {
	// must be called here, because we unassign vars during analyzeConflict
	heuristic_->undoUntil( *this, levels_.back().trailPos );
	uint32 onLevel  = 0;        // number of literals from the current DL in resolvent
	uint32 resSize  = 0;        // size of current resolvent
	Literal p;                  // literal to be resolved out next
	cc_.assign(1, p);           // will later be replaced with asserting literal
	Antecedent lhs, rhs, last;  // resolve operands
	const bool doOtfs = strategy_.otfs > 0;
	for (bumpAct_.clear();;) {
		uint32 lhsSize = resSize;
		uint32 rhsSize = 0;
		heuristic_->updateReason(*this, conflict_, p);
		for (LitVec::size_type i = 0; i != conflict_.size(); ++i) {
			Literal& q = conflict_[i];
			uint32 cl  = level(q.var());
			rhsSize   += (cl != 0);
			if (!seen(q.var())) {
				++resSize;
				assert(isTrue(q) && "Invalid literal in reason set!");
				assert(cl > 0 && "Top-Level implication not marked!");
				markSeen(q.var());
				if (cl == decisionLevel()) {
					++onLevel;
				}
				else {
					cc_.push_back(~q);
					markLevel(cl);
				}
			}
		}
		if (resSize != lhsSize) { lhs = 0; }
		if (rhsSize != resSize) { rhs = 0; }
		if (doOtfs && (!rhs.isNull() || !lhs.isNull())) {
			// resolvent subsumes rhs and possibly also lhs
			otfs(lhs, rhs, p, onLevel == 1);
		}
		assert(onLevel > 0 && "CONFLICT MUST BE ANALYZED ON CONFLICT LEVEL!");
		// search for the last assigned literal that needs to be analyzed...
		while (!seen(assign_.last().var())) {
			assign_.undoLast();
		}
		p   = assign_.last();
		rhs = reason(p);
		clearSeen(p.var());
		if (--onLevel == 0) {
			break;
		}
		--resSize; // p will be resolved out next
		last = rhs;
		reason(p, conflict_);
	}
	cc_[0] = ~p; // store the 1-UIP
	assert(decisionLevel() == level(cc_[0].var()));
	ClauseHead* lastRes = 0;
	if (strategy_.otfs > 1 || !lhs.isNull()) {
		if (!lhs.isNull()) {
			lastRes = clause(lhs);
		}
		else if (cc_.size() <= (conflict_.size()+1)) {
			lastRes = clause(last);
		}
	}
	if (strategy_.bumpVarAct && reason(p).learnt()) {
		bumpAct_.push_back(WeightLiteral(p, reason(p).constraint()->activity().lbd()));
	}
	return simplifyConflictClause(cc_, ccInfo_, lastRes);
}